

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O2

bool_t priIsSmooth(word *a,size_t n,size_t base_count,void *stack)

{
  word w;
  bool_t bVar1;
  size_t sVar2;
  word wVar3;
  word *pwVar4;
  ulong uVar5;
  
  wwCopy((word *)stack,a,n);
  sVar2 = wwLoZeroBits((word *)stack,n);
  wwShLo((word *)stack,n,sVar2);
  sVar2 = wwWordSize((word *)stack,n);
  bVar1 = wwIsW((word *)stack,sVar2,1);
  if (bVar1 == 0) {
    uVar5 = 0;
    do {
      pwVar4 = _base + uVar5;
      while( true ) {
        if (base_count <= uVar5) {
          return 0;
        }
        w = *pwVar4;
        wVar3 = zzModW2((word *)stack,sVar2,w);
        if (wVar3 == 0) break;
        uVar5 = uVar5 + 1;
        pwVar4 = pwVar4 + 1;
      }
      zzDivW((word *)stack,(word *)stack,sVar2,w);
      sVar2 = wwWordSize((word *)stack,sVar2);
      bVar1 = wwIsW((word *)stack,sVar2,1);
    } while (bVar1 == 0);
  }
  return 1;
}

Assistant:

bool_t priIsSmooth(const word a[], size_t n, size_t base_count, void* stack)
{
	register size_t i;
	register word mod;
	// переменные в stack
	word* t = (word*)stack;
	// pre
	ASSERT(base_count <= priBaseSize());
	// t <- a 
	wwCopy(t, a, n);
	// разделить t на степень 2
	i = wwLoZeroBits(t, n);
	wwShLo(t, n, i);
	n = wwWordSize(t, n);
	if (wwIsW(t, n, 1))
	{
		i = 0;
		return TRUE;
	}
	// цикл по простым из факторной базы
	for (i = 0; i < base_count;)
	{
		mod = _base[i] < WORD_BIT_HALF ? 
			zzModW2(t, n, _base[i]) : zzModW(t, n, _base[i]);
		// делится на простое?
		if (mod == 0)
		{
			zzDivW(t, t, n, _base[i]);
			n = wwWordSize(t, n);
			if (wwIsW(t, n, 1))
			{
				i = 0, mod = 0;
				return TRUE;
			}
		}
		// .. не делится
		else 
			++i;
	}
	i = 0, mod = 0;
	return FALSE;
}